

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

StructType * __thiscall
deqp::gls::ub::ShaderInterface::allocStruct(ShaderInterface *this,char *name)

{
  size_type sVar1;
  StructType *this_00;
  reference ppSVar2;
  StructType *local_20;
  char *local_18;
  char *name_local;
  ShaderInterface *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  sVar1 = std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::
          size(&this->m_structs);
  std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::reserve
            (&this->m_structs,sVar1 + 1);
  this_00 = (StructType *)operator_new(0x38);
  StructType::StructType(this_00,local_18);
  local_20 = this_00;
  std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::push_back
            (&this->m_structs,&local_20);
  ppSVar2 = std::vector<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::
            back(&this->m_structs);
  return *ppSVar2;
}

Assistant:

StructType& ShaderInterface::allocStruct (const char* name)
{
	m_structs.reserve(m_structs.size()+1);
	m_structs.push_back(new StructType(name));
	return *m_structs.back();
}